

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O3

void __thiscall fizplex::LP::add_value(LP *this,size_t row,size_t column,double value)

{
  ulong uVar1;
  
  uVar1 = ((long)(this->rows).
                 super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->rows).
                 super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar1 < row || uVar1 - row == 0) {
    __assert_fail("row < row_count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc"
                  ,0x40,"void fizplex::LP::add_value(size_t, size_t, double)");
  }
  uVar1 = ((long)(this->cols).
                 super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->cols).
                 super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (column <= uVar1 && uVar1 - column != 0) {
    ColMatrix::add_value(&this->A,row,column,value);
    return;
  }
  __assert_fail("column < column_count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc",
                0x41,"void fizplex::LP::add_value(size_t, size_t, double)");
}

Assistant:

void LP::add_value(size_t row, size_t column, double value) {
  assert(row < row_count());
  assert(column < column_count());

  A.add_value(row, column, value);
}